

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_movem_16_re_al(void)

{
  uint uVar1;
  uint address;
  long lVar2;
  int iVar3;
  
  uVar1 = m68ki_read_imm_16();
  address = m68ki_read_imm_32();
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    if ((uVar1 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
      m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,(uint)(ushort)m68ki_cpu.dar[lVar2]);
      address = address + 2;
      iVar3 = iVar3 + 1;
    }
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar3 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_re_al(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AL_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_DA[i]));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}